

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O2

void __thiscall
xLearn::MODEL_TEST_Save_and_Load_Test::MODEL_TEST_Save_and_Load_Test
          (MODEL_TEST_Save_and_Load_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014e218;
  return;
}

Assistant:

TEST(MODEL_TEST, Save_and_Load) {
  // Init model
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 
                    hyper_param.auxiliary_size);
  real_t* w = model_ffm.GetParameter_w();
  index_t w_len = model_ffm.GetNumParameter_w();
  for (int i = 0; i < w_len; ++i) {
    w[i] = 2.5;
  }
  real_t* v = model_ffm.GetParameter_v();
  index_t v_len = model_ffm.GetNumParameter_v();
  for (int i = 0; i < v_len; ++i) {
    v[i] = 3.5;
  }
  model_ffm.Serialize(hyper_param.model_file);
  Model new_model(hyper_param.model_file);
  real_t* b = new_model.GetParameter_b();
  w = new_model.GetParameter_w();
  w_len = new_model.GetNumParameter_w();
  v = new_model.GetParameter_v();
  v_len = new_model.GetNumParameter_v();
  index_t param_num_w = hyper_param.num_feature * 2;
  index_t param_num_v = hyper_param.num_feature *
                      hyper_param.num_field *
                      hyper_param.num_K * 2;
  EXPECT_EQ(w_len, param_num_w);
  EXPECT_EQ(v_len, param_num_v);
  EXPECT_EQ(param_num_v+param_num_w+2, new_model.GetNumParameter());
  EXPECT_EQ(hyper_param.score_func, new_model.GetScoreFunction());
  EXPECT_EQ(hyper_param.loss_func, new_model.GetLossFunction());
  EXPECT_EQ(hyper_param.num_K, new_model.GetNumK());
  EXPECT_EQ(hyper_param.num_feature, new_model.GetNumFeature());
  EXPECT_EQ(hyper_param.num_field, new_model.GetNumField());
  EXPECT_EQ(hyper_param.auxiliary_size, new_model.GetAuxiliarySize());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  for (int i = 0; i < w_len; ++i) {
    EXPECT_FLOAT_EQ(w[i], 2.5);
  }
  for (int i = 0; i < v_len; ++i) {
    EXPECT_FLOAT_EQ(v[i], 3.5);
  }
  RemoveFile(hyper_param.model_file.c_str());
}